

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_obj.cpp
# Opt level: O0

Bdd * __thiscall sylvan::Bdd::operator*=(Bdd *this,Bdd *other)

{
  BDD BVar1;
  BDDVAR in_ECX;
  Bdd *other_local;
  Bdd *this_local;
  
  BVar1 = sylvan_and_RUN((sylvan *)this->bdd,other->bdd,0,in_ECX);
  this->bdd = BVar1;
  return this;
}

Assistant:

Bdd&
Bdd::operator*=(const Bdd& other)
{
    bdd = sylvan_and(bdd, other.bdd);
    return *this;
}